

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoProcessing.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  uchar *puVar3;
  ulong uVar4;
  uchar **in_R8;
  ulong uVar5;
  int rank;
  allocator local_169;
  _InputArray local_168;
  char finalWinName [14];
  undefined8 local_134;
  int argc_local;
  VideoCapture cap;
  char **argv_local;
  Mat frame;
  Mat local_90 [96];
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  MPI_Comm_size(&ompi_mpi_comm_world);
  WIDTH = 0x280;
  HEIGHT = 0x1e0;
  uVar5 = 0;
  lVar1 = (long)numberProcesses;
  iVar2 = (int)(0x1e0 / lVar1);
  stripSize = iVar2;
  stripImage = (uchar *)malloc((long)(iVar2 * 0x280));
  stripMatrix = (uchar **)malloc((long)iVar2 * 8);
  uVar4 = 0x1e0 / lVar1 & 0xffffffff;
  if (iVar2 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    puVar3 = (uchar *)malloc(0x280);
    stripMatrix[uVar5] = puVar3;
  }
  fullImage = (uchar *)malloc(0x4b000);
  do {
    iVar2 = (int)in_R8;
    if (rank == 0) {
      cv::VideoCapture::VideoCapture(&cap,0,0);
      cv::Mat::Mat(&frame);
      cv::VideoCapture::operator>>(&cap,&frame);
      local_168.sz.width = 0;
      local_168.sz.height = 0;
      local_168.flags = 0x1010000;
      finalWinName[0] = '\0';
      finalWinName[1] = '\0';
      finalWinName[2] = '\x01';
      finalWinName[3] = '\x02';
      finalWinName._8_6_ = SUB86((_InputArray *)&frame,0);
      local_168.obj = (_InputArray *)&frame;
      cv::cvtColor((cv *)&local_168,(_InputArray *)finalWinName,(_OutputArray *)0x6,0,iVar2);
      cv::Mat::Mat(local_90,&frame);
      readImage(local_90);
      cv::Mat::~Mat(local_90);
      cv::Mat::~Mat(&frame);
      cv::VideoCapture::~VideoCapture(&cap);
    }
    MPI_Bcast(&WIDTH,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    MPI_Bcast(&HEIGHT,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    MPI_Bcast(&MAX_COLOR,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    horizontalStrips(rank);
    sendStripstoAllProcesses(rank);
    in_R8 = stripMatrix;
    cv::Mat::Mat(&frame,stripSize,WIDTH,0,stripMatrix,0);
    cv::Mat::operator=((Mat *)stripImageMat,&frame);
    cv::Mat::~Mat(&frame);
    stripImageMat._16_8_ = tempBuffer;
    MPI_Barrier(&ompi_mpi_comm_world);
    _frame = 0x1010000;
    _cap = 0x2010000;
    local_134 = 0x700000007;
    cv::GaussianBlur(0x3ff8000000000000,0x3ff8000000000000,(_InputArray *)&frame,&cap,&local_134);
    _frame = 0x1010000;
    _cap = 0x2010000;
    cv::Canny((_InputArray *)&frame,(_OutputArray *)&cap,0.0,30.0,3,false);
    stichImages();
    if (rank == 0) {
      in_R8 = (uchar **)fullImage;
      cv::Mat::Mat(&frame,HEIGHT,WIDTH,0,fullImage,0);
      builtin_strncpy(finalWinName + 8,"ndow ",6);
      builtin_strncpy(finalWinName,"Final wi",8);
      std::__cxx11::string::string((string *)&cap,finalWinName,&local_169);
      local_168.sz.width = 0;
      local_168.sz.height = 0;
      local_168.flags = 0x1010000;
      local_168.obj = (_InputArray *)&frame;
      cv::imshow((string *)&cap,&local_168);
      std::__cxx11::string::~string((string *)&cap);
      cv::Mat::~Mat(&frame);
    }
    iVar2 = cv::waitKey(1);
  } while (iVar2 != 0x1b);
  cleanUp();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    int i, j, bufferInt[20], rank;
    char imageFile[20];

    MPI_Status status;
    MPI_Request *requests;
    MPI_Status *statuses;
    MPI_Init(&argc, &argv);
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    MPI_Comm_size(MPI_COMM_WORLD, &numberProcesses);
    WIDTH=640;
    HEIGHT=480;
    stripSize=HEIGHT/numberProcesses;
    stripImage = (unsigned char *) malloc(WIDTH * stripSize * sizeof(unsigned char));
    stripMatrix = (unsigned char **) malloc(stripSize * sizeof(unsigned char *));
    for (i = 0; i < stripSize; i++) {
        stripMatrix[i] = (unsigned char *) malloc(WIDTH * sizeof(unsigned char));
    }
    fullImage = (unsigned char *) malloc(WIDTH * HEIGHT * sizeof(unsigned char));
    while (1) {
        if (rank == 0) {
            VideoCapture cap(0);
            Mat frame;
            cap >> frame; // get a new frame from camera
            cvtColor(frame, frame, COLOR_BGR2GRAY);
            //readImage("../res/images.jpg");
            readImage(frame);
            //Start Communication
            //cout<<"Communication started";
        }

        MPI_Bcast(&WIDTH, 1, MPI_INT, 0, MPI_COMM_WORLD);
        MPI_Bcast(&HEIGHT, 1, MPI_INT, 0, MPI_COMM_WORLD);
        MPI_Bcast(&MAX_COLOR, 1, MPI_INT, 0, MPI_COMM_WORLD);

        horizontalStrips(rank);
        //printf("\n[Process %d] Image Width: %d X %d => strip size: %d (%d..%d)\n", rank, WIDTH, HEIGHT, stripSize, stripStart, stripEnd);


        sendStripstoAllProcesses(rank);
        stripImageMat = Mat(stripSize, WIDTH, CV_8U, stripMatrix);
        stripImageMat.data = tempBuffer;
        //stripImageMat = stripImageMat(Rect(0, 0, WIDTH, stripSize));
        /*char winName[] = "window at rank ";
        winName[15] = rank + '0';
        winName[16] = '\0';
        imshow(winName, stripImageMat);*/
        //waitKey(0);


        //writeIntermediatoryImage();
        MPI_Barrier(MPI_COMM_WORLD);
        //TODO: Do whatever you wnant to. The intermediatory images are generated in "/res/it". Apply any filter or operation you want.
        GaussianBlur(stripImageMat, stripImageMat, Size(7, 7), 1.5, 1.5);
        Canny(stripImageMat, stripImageMat, 0, 30, 3);
        stichImages();
        if (rank == 0) {
            //writeStichedImage("../res/final.pgm");
            Mat fullImageMat = Mat(HEIGHT, WIDTH, CV_8U, fullImage);
            //stripImageMat.data = fullImage;
            //stripImageMat = stripImageMat(Rect(0, 0, WIDTH, stripSize));
            char finalWinName[] = "Final window ";
            imshow(finalWinName, fullImageMat);
        }
        if (waitKey(1) == 27) break;
    }
    cleanUp();
    MPI_Finalize();

    return 0;
}